

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall ByteCodeGenerator::DefineLabels(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  Type pPVar1;
  code *pcVar2;
  bool bVar3;
  ByteCodeLabel BVar4;
  undefined4 *puVar5;
  Type *ppPVar6;
  ByteCodeWriter *this_00;
  SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount> *pSVar7;
  Iterator local_40;
  
  this_00 = &this->m_writer;
  BVar4 = Js::ByteCodeWriter::DefineLabel(this_00);
  funcInfo->singleExit = BVar4;
  pSVar7 = &(funcInfo->targetStatements).
            super_SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount>;
  local_40.list = pSVar7;
  local_40.current = &pSVar7->super_SListNodeBase<Memory::ArenaAllocator>;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  while( true ) {
    if (pSVar7 == (SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      pSVar7 = (SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
    }
    local_40.current =
         (((SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount> *)
          &pSVar7->super_SListNodeBase<Memory::ArenaAllocator>)->
         super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current ==
        local_40.list) break;
    ppPVar6 = SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        (&local_40);
    pPVar1 = *ppPVar6;
    BVar4 = Js::ByteCodeWriter::DefineLabel(this_00);
    pPVar1->breakLabel = BVar4;
    BVar4 = Js::ByteCodeWriter::DefineLabel(this_00);
    pPVar1->continueLabel = BVar4;
    pPVar1->emitLabels = true;
    pSVar7 = (SListBase<ParseNodeStmt_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
  }
  return;
}

Assistant:

void ByteCodeGenerator::DefineLabels(FuncInfo *funcInfo)
{
    funcInfo->singleExit = m_writer.DefineLabel();
    SList<ParseNodeStmt *>::Iterator iter(&funcInfo->targetStatements);
    while (iter.Next())
    {
        ParseNodeStmt * node = iter.Data();
        node->breakLabel = m_writer.DefineLabel();
        node->continueLabel = m_writer.DefineLabel();
        node->emitLabels = true;
    }
}